

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O2

int __thiscall
stackjit::ClassMetadata::getVirtualFunctionIndex(ClassMetadata *this,FunctionDefinition *funcDef)

{
  int iVar1;
  FunctionDefinition *function;
  string *psVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  string signature;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  function = getVirtualFunctionRootDefinition(this,funcDef);
  FunctionSignature::from((FunctionSignature *)&bStack_b8,function);
  psVar2 = FunctionSignature::str_abi_cxx11_((FunctionSignature *)&bStack_b8);
  std::__cxx11::string::string((string *)&signature,(string *)psVar2);
  std::__cxx11::string::~string((string *)&bStack_b8);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count(&(this->mVirtualFunctionToIndex)._M_h,&signature);
  if (sVar3 != 0) {
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&this->mVirtualFunctionToIndex,&signature);
    iVar1 = *pmVar4;
    std::__cxx11::string::~string((string *)&signature);
    return iVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_78,"There exists no virtual function \'",&signature);
  std::operator+(&local_58,&local_78,"\' in the class \'");
  std::operator+(&local_38,&local_58,&this->mName);
  std::operator+(&bStack_b8,&local_38,"\'.");
  std::runtime_error::runtime_error(this_00,(string *)&bStack_b8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int ClassMetadata::getVirtualFunctionIndex(const FunctionDefinition& funcDef) const {
		auto rootDef = getVirtualFunctionRootDefinition(&funcDef);
		auto signature = FunctionSignature::from(*rootDef).str();
		if (mVirtualFunctionToIndex.count(signature) == 0) {
			throw std::runtime_error("There exists no virtual function '" + signature + "' in the class '" + mName + "'.");
		}

		return mVirtualFunctionToIndex.at(signature);
	}